

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O2

istream * operator>>(istream *in,Company *company)

{
  int iVar1;
  int i;
  long lVar2;
  
  std::istream::operator>>((istream *)in,&company->budget);
  operator>>(in,company->boss);
  lVar2 = 0;
  while( true ) {
    iVar1 = Boss::getNumberOfEmployees(company->boss);
    if (iVar1 <= lVar2) break;
    operator>>(in,company->employees[lVar2]);
    lVar2 = lVar2 + 1;
  }
  return in;
}

Assistant:

istream &operator>>(istream &in, Company &company) {
    in >> company.budget;
    in >> (*company.boss);
    for (int i = 0; i < company.boss->getNumberOfEmployees(); ++i) {
        in >> (*company.employees[i]);
    }
    return in;
}